

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_ccb366::HandleRPathChangeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  KeywordNameAction *pKVar1;
  bool bVar2;
  bool bVar3;
  cmArgumentParser<void> *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  bool removeEnvironmentRPath;
  bool changed;
  cmFileTimes ft;
  string file;
  string message;
  string emsg;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  newRPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  oldRPath;
  ParseResult parseResult;
  cmArgumentParser<void> parser;
  bool local_1fb;
  bool local_1fa;
  char local_1f9;
  undefined1 local_1f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  cmFileTimes local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  bool local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  undefined1 local_120 [32];
  bool local_100;
  undefined1 local_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ParseResult local_c8;
  cmArgumentParser<void> local_98;
  
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_100 = false;
  local_140 = false;
  local_1fb = false;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
  local_98.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
  local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name.super_string_view._M_str = "FILE";
  name.super_string_view._M_len = 4;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  pcVar4 = cmArgumentParser<void>::Bind<std::__cxx11::string>(&local_98,name,&local_1c0);
  name_00.super_string_view._M_str = "OLD_RPATH";
  name_00.super_string_view._M_len = 9;
  pcVar4 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar4,name_00,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_120);
  name_01.super_string_view._M_str = "NEW_RPATH";
  name_01.super_string_view._M_len = 9;
  pcVar4 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar4,name_01,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_160);
  name_02.super_string_view._M_str = "INSTALL_REMOVE_ENVIRONMENT_RPATH";
  name_02.super_string_view._M_len = 0x20;
  cmArgumentParser<void>::Bind<bool>(pcVar4,name_02,&local_1fb);
  local_1f8._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1f8._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  cmArgumentParser<void>::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_c8,&local_98,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1f8,&local_138,0);
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = ArgumentParser::ParseResult::MaybeReportError(&local_c8,status->Makefile);
    bVar3 = true;
    if (bVar2) goto LAB_002deb6a;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_1c0._M_string_length ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_1f8._0_8_ = &local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"RPATH_CHANGE not given FILE option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else if (local_100 == false) {
      local_1f8._0_8_ = &local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"RPATH_CHANGE not given OLD_RPATH option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (local_140 != false) {
        bVar2 = cmsys::SystemTools::FileExists(&local_1c0,true);
        if (bVar2) {
          cmFileTimes::cmFileTimes(&local_1c8,&local_1c0);
          local_180._8_8_ = 0;
          local_180[0x10] = '\0';
          local_180._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_180 + 0x10);
          bVar3 = cmSystemTools::ChangeRPath
                            (&local_1c0,(string *)local_120,(string *)local_160,local_1fb,
                             (string *)local_180,&local_1fa);
          if (bVar3) {
            if (local_1fa == true) {
              local_1f8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15;
              local_1f8._8_8_ = "Set runtime path of \"";
              local_f8._0_8_ = local_1c0._M_string_length;
              local_f8._8_8_ = local_1c0._M_dataplus._M_p;
              local_1f9 = '\"';
              cmStrCat<char[7],std::__cxx11::string,char>
                        (&local_1a0,(cmAlphaNum *)local_1f8,(cmAlphaNum *)local_f8,
                         (char (*) [7])"\" to \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,&local_1f9);
              cmMakefile::DisplayStatus(status->Makefile,&local_1a0,-1.0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
            }
            cmFileTimes::Store(&local_1c8,&local_1c0);
          }
          else {
            local_1f8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a;
            local_1f8._8_8_ = "RPATH_CHANGE could not write new RPATH:\n  ";
            local_f8._0_8_ = local_160._8_8_;
            local_f8._8_8_ = local_160._0_8_;
            cmStrCat<char[17],std::__cxx11::string,char[2],std::__cxx11::string>
                      (&local_1a0,(cmAlphaNum *)local_1f8,(cmAlphaNum *)local_f8,
                       (char (*) [17])"\nto the file:\n  ",&local_1c0,(char (*) [2])0x70d3d9,
                       (string *)local_180);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_180 + 0x10)) {
            operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
          }
          cmFileTimes::~cmFileTimes(&local_1c8);
          goto LAB_002deb6a;
        }
        local_1f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19;
        local_1f8._8_8_ = "RPATH_CHANGE given FILE \"";
        local_f8._0_8_ = local_1c0._M_string_length;
        local_f8._8_8_ = local_1c0._M_dataplus._M_p;
        cmStrCat<char[23]>((string *)local_180,(cmAlphaNum *)local_1f8,(cmAlphaNum *)local_f8,
                           (char (*) [23])"\" that does not exist.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_180 + 0x10))
        {
          local_e8._M_dataplus._M_p = (pointer)CONCAT71(local_180._17_7_,local_180[0x10]);
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_180._0_8_;
          goto LAB_002deb60;
        }
        goto LAB_002deb68;
      }
      local_1f8._0_8_ = &local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"RPATH_CHANGE not given NEW_RPATH option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    local_e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_ !=
        &local_1e8) goto LAB_002deb60;
  }
  else {
    local_1e8._M_string_length =
         (size_type)
         ((local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_1e8._M_dataplus._M_p =
         (pointer)(local_138.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_1f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x24;
    local_1f8._8_8_ = "RPATH_CHANGE given unknown argument ";
    views._M_len = 2;
    views._M_array = (iterator)local_1f8;
    cmCatViews_abi_cxx11_((string *)local_f8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_ !=
        &local_e8) {
LAB_002deb60:
      operator_delete(pbVar5,(ulong)(local_e8._M_dataplus._M_p + 1));
    }
  }
LAB_002deb68:
  bVar3 = false;
LAB_002deb6a:
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&local_98.super_Base.Bindings.Positions.
             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           );
  if (local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pKVar1 = &local_98.super_Base.Bindings.ParsedKeyword;
    (*local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager)
              ((_Any_data *)pKVar1,(_Any_data *)pKVar1,__destroy_functor);
  }
  if (local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pKVar1 = &local_98.super_Base.Bindings.KeywordMissingValue;
    (*local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager)
              ((_Any_data *)pKVar1,(_Any_data *)pKVar1,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_98);
  if ((local_140 == true) && (local_140 = false, (undefined1 *)local_160._0_8_ != local_160 + 0x10))
  {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  if ((local_100 == true) && (local_100 = false, (undefined1 *)local_120._0_8_ != local_120 + 0x10))
  {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool HandleRPathChangeCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  // Evaluate arguments.
  std::string file;
  cm::optional<std::string> oldRPath;
  cm::optional<std::string> newRPath;
  bool removeEnvironmentRPath = false;
  cmArgumentParser<void> parser;
  std::vector<std::string> unknownArgs;
  parser.Bind("FILE"_s, file)
    .Bind("OLD_RPATH"_s, oldRPath)
    .Bind("NEW_RPATH"_s, newRPath)
    .Bind("INSTALL_REMOVE_ENVIRONMENT_RPATH"_s, removeEnvironmentRPath);
  ArgumentParser::ParseResult parseResult =
    parser.Parse(cmMakeRange(args).advance(1), &unknownArgs);
  if (!unknownArgs.empty()) {
    status.SetError(
      cmStrCat("RPATH_CHANGE given unknown argument ", unknownArgs.front()));
    return false;
  }
  if (parseResult.MaybeReportError(status.GetMakefile())) {
    return true;
  }
  if (file.empty()) {
    status.SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    status.SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    status.SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    status.SetError(
      cmStrCat("RPATH_CHANGE given FILE \"", file, "\" that does not exist."));
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool changed;

  if (!cmSystemTools::ChangeRPath(file, *oldRPath, *newRPath,
                                  removeEnvironmentRPath, &emsg, &changed)) {
    status.SetError(cmStrCat("RPATH_CHANGE could not write new RPATH:\n  ",
                             *newRPath, "\nto the file:\n  ", file, "\n",
                             emsg));
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message =
        cmStrCat("Set runtime path of \"", file, "\" to \"", *newRPath, '"');
      status.GetMakefile().DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}